

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

int __thiscall btSoftBody::generateClusters(btSoftBody *this,int k,int maxiterations)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Cluster **ppCVar4;
  Node **ppNVar5;
  Tetra *pTVar6;
  Face *pFVar7;
  bool *ptr;
  Cluster *pCVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Cluster **ppCVar13;
  long lVar14;
  Cluster *pCVar15;
  Node **ppNVar16;
  btVector3 *pbVar17;
  ulong uVar18;
  btScalar *pbVar19;
  int *__s;
  bool *pbVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int curSize;
  uint uVar26;
  ulong uVar27;
  bool bVar28;
  int q;
  int iVar29;
  int iVar30;
  Cluster *cla;
  int j;
  Node *pNVar31;
  ulong uVar32;
  ulong uVar33;
  int i;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  btAlignedObjectArray<btVector3> centers;
  btAlignedObjectArray<int> cids;
  int idx [3];
  float local_118;
  float local_f8;
  float fStack_f4;
  btAlignedObjectArray<btVector3> local_e0;
  int local_bc;
  btAlignedObjectArray<int> local_b8;
  int local_94 [3];
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_78;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar12 = (this->m_clusters).m_size;
  local_bc = maxiterations;
  while (0 < iVar12) {
    releaseCluster(this,0);
    iVar12 = (this->m_clusters).m_size;
  }
  uVar10 = (this->m_nodes).m_size;
  if ((int)uVar10 < k) {
    k = uVar10;
  }
  if (iVar12 < k) {
    if ((this->m_clusters).m_capacity < k) {
      if (k == 0) {
        ppCVar13 = (Cluster **)0x0;
      }
      else {
        ppCVar13 = (Cluster **)btAlignedAllocInternal((long)k * 8,0x10);
        lVar14 = (long)(this->m_clusters).m_size;
        if (0 < lVar14) {
          lVar22 = 0;
          do {
            ppCVar13[lVar22] = (this->m_clusters).m_data[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar14 != lVar22);
        }
      }
      ppCVar4 = (this->m_clusters).m_data;
      if ((ppCVar4 != (Cluster **)0x0) && ((this->m_clusters).m_ownsMemory == true)) {
        btAlignedFreeInternal(ppCVar4);
      }
      (this->m_clusters).m_ownsMemory = true;
      (this->m_clusters).m_data = ppCVar13;
      (this->m_clusters).m_capacity = k;
    }
    lVar14 = (long)iVar12;
    do {
      (this->m_clusters).m_data[lVar14] = (Cluster *)0x0;
      lVar14 = lVar14 + 1;
    } while (k != lVar14);
    (this->m_clusters).m_size = k;
    if (k < 1) goto LAB_001d87f9;
    lVar14 = 0;
    do {
      pCVar15 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
      (pCVar15->m_masses).m_ownsMemory = true;
      (pCVar15->m_masses).m_data = (float *)0x0;
      (pCVar15->m_masses).m_size = 0;
      (pCVar15->m_masses).m_capacity = 0;
      (pCVar15->m_nodes).m_ownsMemory = true;
      (pCVar15->m_nodes).m_data = (Node **)0x0;
      (pCVar15->m_nodes).m_size = 0;
      (pCVar15->m_nodes).m_capacity = 0;
      (pCVar15->m_framerefs).m_ownsMemory = true;
      (pCVar15->m_framerefs).m_data = (btVector3 *)0x0;
      (pCVar15->m_framerefs).m_size = 0;
      (pCVar15->m_framerefs).m_capacity = 0;
      pCVar15->m_leaf = (btDbvtNode *)0x0;
      pCVar15->m_ndamping = 0.0;
      pCVar15->m_ldamping = 0.0;
      pCVar15->m_adamping = 0.0;
      pCVar15->m_matching = 0.0;
      pCVar15->m_maxSelfCollisionImpulse = 100.0;
      pCVar15->m_selfCollisionImpulseFactor = 0.01;
      pCVar15->m_containsAnchor = false;
      (this->m_clusters).m_data[lVar14] = pCVar15;
      (this->m_clusters).m_data[lVar14]->m_collide = true;
      lVar14 = lVar14 + 1;
      k = (this->m_clusters).m_size;
    } while (lVar14 < k);
    if (k < 1) goto LAB_001d87f9;
    local_e0.m_ownsMemory = true;
    iVar29 = 0;
    local_e0.m_data = (btVector3 *)0x0;
    local_e0.m_size = 0;
    local_e0.m_capacity = 0;
    iVar12 = (this->m_nodes).m_size;
    if (iVar12 < 1) {
      local_f8 = 0.0;
      fStack_f4 = 0.0;
      local_118 = 0.0;
    }
    else {
      local_f8 = 0.0;
      fStack_f4 = 0.0;
      local_118 = 0.0;
      lVar14 = 0;
      do {
        pNVar31 = (this->m_nodes).m_data;
        local_118 = local_118 + pNVar31[lVar14].m_x.m_floats[2];
        local_88 = *(undefined8 *)pNVar31[lVar14].m_x.m_floats;
        uStack_80 = 0;
        pCVar15 = (this->m_clusters).m_data
                  [(long)((int)lVar14 * 0x74b1) % (long)(this->m_clusters).m_size & 0xffffffff];
        uVar10 = (pCVar15->m_nodes).m_size;
        if (uVar10 == (pCVar15->m_nodes).m_capacity) {
          iVar29 = uVar10 * 2;
          if (uVar10 == 0) {
            iVar29 = 1;
          }
          if ((int)uVar10 < iVar29) {
            if (iVar29 == 0) {
              ppNVar16 = (Node **)0x0;
            }
            else {
              ppNVar16 = (Node **)btAlignedAllocInternal((long)iVar29 << 3,0x10);
              uVar10 = (pCVar15->m_nodes).m_size;
            }
            if (0 < (int)uVar10) {
              uVar24 = 0;
              do {
                ppNVar16[uVar24] = (pCVar15->m_nodes).m_data[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar10 != uVar24);
            }
            ppNVar5 = (pCVar15->m_nodes).m_data;
            if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
              btAlignedFreeInternal(ppNVar5);
              uVar10 = (pCVar15->m_nodes).m_size;
            }
            (pCVar15->m_nodes).m_ownsMemory = true;
            (pCVar15->m_nodes).m_data = ppNVar16;
            (pCVar15->m_nodes).m_capacity = iVar29;
            iVar12 = (this->m_nodes).m_size;
          }
        }
        local_f8 = local_f8 + (float)local_88;
        fStack_f4 = fStack_f4 + local_88._4_4_;
        (pCVar15->m_nodes).m_data[(int)uVar10] = pNVar31 + lVar14;
        (pCVar15->m_nodes).m_size = uVar10 + 1;
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar12);
      iVar29 = local_e0.m_size;
    }
    uVar24 = (ulong)(uint)k;
    if (iVar29 < k) {
      if (local_e0.m_capacity < k) {
        pbVar17 = (btVector3 *)btAlignedAllocInternal(uVar24 << 4,0x10);
        if ((long)local_e0.m_size < 1) {
          if (local_e0.m_data != (btVector3 *)0x0) goto LAB_001d8d37;
        }
        else {
          lVar14 = 0;
          do {
            puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar14);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)((long)pbVar17->m_floats + lVar14);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar14 = lVar14 + 0x10;
          } while ((long)local_e0.m_size * 0x10 != lVar14);
LAB_001d8d37:
          if (local_e0.m_ownsMemory == true) {
            btAlignedFreeInternal(local_e0.m_data);
          }
        }
        local_e0.m_ownsMemory = true;
        local_e0._4_8_ = (ulong)(uint)k << 0x20;
        local_e0.m_data = pbVar17;
      }
      fVar34 = 1.0 / (float)iVar12;
      lVar14 = uVar24 - (long)iVar29;
      uVar18 = (long)iVar29 << 4 | 0xc;
      do {
        *(ulong *)((long)(local_e0.m_data)->m_floats + (uVar18 - 0xc)) =
             CONCAT44(fStack_f4 * fVar34,local_f8 * fVar34);
        *(float *)((long)(local_e0.m_data)->m_floats + (uVar18 - 4)) = local_118 * fVar34;
        *(undefined4 *)((long)(local_e0.m_data)->m_floats + uVar18) = 0;
        uVar18 = uVar18 + 0x10;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    local_e0.m_size = k;
    uVar18 = 2;
    if (2 < k) {
      uVar18 = (ulong)(uint)k;
    }
    local_70 = 0;
    local_78 = uVar24;
    do {
      uVar24 = local_78;
      fVar34 = (float)(int)local_70 * 0.0625;
      local_68 = 1.0;
      if (fVar34 <= 1.0) {
        local_68 = fVar34;
      }
      local_68 = 2.0 - local_68;
      local_70 = (ulong)((int)local_70 + 1);
      local_58 = ZEXT416((uint)local_68);
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      uVar33 = 0;
      bVar9 = 0;
      do {
        pCVar15 = (this->m_clusters).m_data[uVar33];
        iVar12 = (pCVar15->m_nodes).m_size;
        if ((long)iVar12 < 1) {
          fVar36 = 0.0;
          fVar38 = 0.0;
          fVar34 = 0.0;
        }
        else {
          fVar34 = 0.0;
          lVar14 = 0;
          fVar36 = 0.0;
          fVar38 = 0.0;
          do {
            pNVar31 = (pCVar15->m_nodes).m_data[lVar14];
            uVar3 = *(undefined8 *)(pNVar31->m_x).m_floats;
            fVar36 = fVar36 + (float)uVar3;
            fVar38 = fVar38 + (float)((ulong)uVar3 >> 0x20);
            fVar34 = fVar34 + (pNVar31->m_x).m_floats[2];
            lVar14 = lVar14 + 1;
          } while (iVar12 != lVar14);
        }
        if (iVar12 != 0) {
          fVar35 = 1.0 / (float)iVar12;
          fVar37 = local_e0.m_data[uVar33].m_floats[2];
          local_48 = *(undefined8 *)local_e0.m_data[uVar33].m_floats;
          fVar39 = (float)((ulong)local_48 >> 0x20);
          uStack_40 = 0;
          fVar36 = (fVar36 * fVar35 - (float)local_48) * local_68 + (float)local_48;
          fVar39 = (fVar38 * fVar35 - fVar39) * fStack_64 + fVar39;
          local_88 = CONCAT44(local_88._4_4_,fVar37);
          fVar37 = (fVar34 * fVar35 - fVar37) * (float)local_58._0_4_ + fVar37;
          *(ulong *)local_e0.m_data[uVar33].m_floats = CONCAT44(fVar39,fVar36);
          *(ulong *)(local_e0.m_data[uVar33].m_floats + 2) = (ulong)(uint)fVar37;
          pCVar15 = (this->m_clusters).m_data[uVar33];
          lVar14 = (long)(pCVar15->m_nodes).m_size;
          if (lVar14 < 0) {
            if ((pCVar15->m_nodes).m_capacity < 0) {
              ppNVar16 = (pCVar15->m_nodes).m_data;
              if ((ppNVar16 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
                btAlignedFreeInternal(ppNVar16);
              }
              (pCVar15->m_nodes).m_ownsMemory = true;
              (pCVar15->m_nodes).m_data = (Node **)0x0;
              (pCVar15->m_nodes).m_capacity = 0;
            }
            do {
              (pCVar15->m_nodes).m_data[lVar14] = (Node *)0x0;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0);
          }
          fVar36 = fVar36 - (float)local_48;
          fVar39 = fVar39 - local_48._4_4_;
          fVar37 = fVar37 - (float)local_88;
          (pCVar15->m_nodes).m_size = 0;
          bVar9 = bVar9 | 1.1920929e-07 < fVar37 * fVar37 + fVar36 * fVar36 + fVar39 * fVar39;
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar24);
      uVar10 = (this->m_nodes).m_size;
      uVar24 = (ulong)uVar10;
      if (0 < (int)uVar10) {
        lVar14 = 0;
        do {
          pNVar31 = (this->m_nodes).m_data;
          if (k == 1) {
            lVar22 = 0;
          }
          else {
            uVar3 = *(undefined8 *)pNVar31[lVar14].m_x.m_floats;
            fVar38 = (float)uVar3;
            fVar37 = (float)((ulong)uVar3 >> 0x20);
            fVar34 = pNVar31[lVar14].m_x.m_floats[2];
            fVar36 = ABS((local_e0.m_data)->m_floats[2] - fVar34) +
                     ABS((local_e0.m_data)->m_floats[1] - fVar37) +
                     ABS((local_e0.m_data)->m_floats[0] - fVar38);
            pbVar19 = local_e0.m_data[1].m_floats + 2;
            uVar33 = 0;
            uVar27 = 1;
            do {
              fVar35 = ABS(*pbVar19 - fVar34) +
                       ABS((float)((ulong)*(undefined8 *)((btVector3 *)(pbVar19 + -2))->m_floats >>
                                  0x20) - fVar37) +
                       ABS((float)*(undefined8 *)((btVector3 *)(pbVar19 + -2))->m_floats - fVar38);
              if (fVar35 < fVar36) {
                uVar33 = uVar27 & 0xffffffff;
                fVar36 = fVar35;
              }
              uVar27 = uVar27 + 1;
              pbVar19 = pbVar19 + 4;
            } while (uVar18 != uVar27);
            lVar22 = (long)(int)uVar33;
          }
          pCVar15 = (this->m_clusters).m_data[lVar22];
          uVar10 = (pCVar15->m_nodes).m_size;
          if (uVar10 == (pCVar15->m_nodes).m_capacity) {
            iVar12 = uVar10 * 2;
            if (uVar10 == 0) {
              iVar12 = 1;
            }
            if ((int)uVar10 < iVar12) {
              if (iVar12 == 0) {
                ppNVar16 = (Node **)0x0;
              }
              else {
                ppNVar16 = (Node **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
                uVar10 = (pCVar15->m_nodes).m_size;
              }
              if (0 < (int)uVar10) {
                uVar24 = 0;
                do {
                  ppNVar16[uVar24] = (pCVar15->m_nodes).m_data[uVar24];
                  uVar24 = uVar24 + 1;
                } while (uVar10 != uVar24);
              }
              ppNVar5 = (pCVar15->m_nodes).m_data;
              if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
                btAlignedFreeInternal(ppNVar5);
                uVar10 = (pCVar15->m_nodes).m_size;
              }
              (pCVar15->m_nodes).m_ownsMemory = true;
              (pCVar15->m_nodes).m_data = ppNVar16;
              (pCVar15->m_nodes).m_capacity = iVar12;
              uVar24 = (ulong)(uint)(this->m_nodes).m_size;
            }
          }
          (pCVar15->m_nodes).m_data[(int)uVar10] = pNVar31 + lVar14;
          (pCVar15->m_nodes).m_size = uVar10 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar24);
      }
    } while ((bool)(bVar9 & (int)local_70 < local_bc));
    local_b8.m_ownsMemory = true;
    local_b8.m_data = (int *)0x0;
    local_b8.m_size = 0;
    local_b8.m_capacity = 0;
    iVar12 = (int)uVar24;
    if (0 < iVar12) {
      __s = (int *)btAlignedAllocInternal(uVar24 << 2,0x10);
      if ((long)local_b8.m_size < 1) {
        if (local_b8.m_data != (int *)0x0) goto LAB_001d91b1;
      }
      else {
        lVar14 = 0;
        do {
          __s[lVar14] = local_b8.m_data[lVar14];
          lVar14 = lVar14 + 1;
        } while (local_b8.m_size != lVar14);
LAB_001d91b1:
        if (local_b8.m_ownsMemory == true) {
          btAlignedFreeInternal(local_b8.m_data);
        }
      }
      local_b8.m_ownsMemory = true;
      local_b8.m_capacity = iVar12;
      local_b8.m_data = __s;
      memset(__s,0xff,uVar24 << 2);
    }
    local_b8.m_size = iVar12;
    iVar12 = (this->m_clusters).m_size;
    if (0 < iVar12) {
      ppCVar13 = (this->m_clusters).m_data;
      pNVar31 = (this->m_nodes).m_data;
      lVar14 = 0;
      do {
        pCVar15 = ppCVar13[lVar14];
        if (0 < (pCVar15->m_nodes).m_size) {
          ppNVar16 = (pCVar15->m_nodes).m_data;
          lVar22 = 0;
          do {
            local_b8.m_data
            [(int)((ulong)((long)ppNVar16[lVar22] - (long)pNVar31) >> 3) * -0x11111111] =
                 (int)lVar14;
            lVar22 = lVar22 + 1;
          } while (lVar22 < (pCVar15->m_nodes).m_size);
          iVar12 = (this->m_clusters).m_size;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar12);
    }
    if (0 < (this->m_faces).m_size) {
      lVar14 = 0;
      do {
        pNVar31 = (this->m_nodes).m_data;
        pFVar7 = (this->m_faces).m_data;
        local_94[0] = (int)((ulong)((long)pFVar7[lVar14].m_n[0] - (long)pNVar31) >> 3) * -0x11111111
        ;
        local_94[1] = (int)((ulong)((long)pFVar7[lVar14].m_n[1] - (long)pNVar31) >> 3) * -0x11111111
        ;
        local_94[2] = (int)((ulong)((long)pFVar7[lVar14].m_n[2] - (long)pNVar31) >> 3) * -0x11111111
        ;
        lVar22 = 0;
        do {
          iVar12 = local_b8.m_data[local_94[lVar22]];
          iVar29 = 1;
          do {
            if (local_b8.m_data[local_94[(uint)((int)lVar22 + iVar29) % 3]] != iVar12) {
              pCVar15 = (this->m_clusters).m_data[iVar12];
              pNVar31 = (this->m_nodes).m_data + local_94[(uint)((int)lVar22 + iVar29) % 3];
              iVar11 = (pCVar15->m_nodes).m_size;
              uVar24 = (ulong)iVar11;
              if (0 < (long)uVar24) {
                uVar18 = 0;
                do {
                  if ((pCVar15->m_nodes).m_data[uVar18] == pNVar31) {
                    if (iVar11 != (int)uVar18) goto LAB_001d9400;
                    break;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar24 != uVar18);
              }
              if (iVar11 == (pCVar15->m_nodes).m_capacity) {
                iVar30 = iVar11 * 2;
                if (iVar11 == 0) {
                  iVar30 = 1;
                }
                if (iVar11 < iVar30) {
                  if (iVar30 == 0) {
                    ppNVar16 = (Node **)0x0;
                  }
                  else {
                    ppNVar16 = (Node **)btAlignedAllocInternal((long)iVar30 << 3,0x10);
                    uVar24 = (ulong)(uint)(pCVar15->m_nodes).m_size;
                  }
                  iVar11 = (int)uVar24;
                  if (0 < iVar11) {
                    uVar18 = 0;
                    do {
                      ppNVar16[uVar18] = (pCVar15->m_nodes).m_data[uVar18];
                      uVar18 = uVar18 + 1;
                    } while ((uVar24 & 0xffffffff) != uVar18);
                  }
                  ppNVar5 = (pCVar15->m_nodes).m_data;
                  if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
                    btAlignedFreeInternal(ppNVar5);
                    iVar11 = (pCVar15->m_nodes).m_size;
                  }
                  (pCVar15->m_nodes).m_ownsMemory = true;
                  (pCVar15->m_nodes).m_data = ppNVar16;
                  (pCVar15->m_nodes).m_capacity = iVar30;
                }
              }
              (pCVar15->m_nodes).m_data[iVar11] = pNVar31;
              (pCVar15->m_nodes).m_size = iVar11 + 1;
            }
LAB_001d9400:
            iVar29 = iVar29 + 1;
          } while (iVar29 != 3);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        lVar14 = lVar14 + 1;
      } while (lVar14 < (this->m_faces).m_size);
      iVar12 = (this->m_clusters).m_size;
    }
    if (1 < iVar12) {
      pCVar15 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
      (pCVar15->m_masses).m_ownsMemory = true;
      (pCVar15->m_masses).m_data = (float *)0x0;
      (pCVar15->m_masses).m_size = 0;
      (pCVar15->m_masses).m_capacity = 0;
      (pCVar15->m_nodes).m_ownsMemory = true;
      (pCVar15->m_nodes).m_data = (Node **)0x0;
      (pCVar15->m_nodes).m_size = 0;
      (pCVar15->m_nodes).m_capacity = 0;
      (pCVar15->m_framerefs).m_ownsMemory = true;
      (pCVar15->m_framerefs).m_data = (btVector3 *)0x0;
      (pCVar15->m_framerefs).m_size = 0;
      (pCVar15->m_framerefs).m_capacity = 0;
      pCVar15->m_leaf = (btDbvtNode *)0x0;
      pCVar15->m_ndamping = 0.0;
      pCVar15->m_ldamping = 0.0;
      pCVar15->m_adamping = 0.0;
      pCVar15->m_matching = 0.0;
      pCVar15->m_maxSelfCollisionImpulse = 100.0;
      pCVar15->m_selfCollisionImpulseFactor = 0.01;
      pCVar15->m_containsAnchor = false;
      pCVar15->m_collide = false;
      iVar12 = (this->m_nodes).m_size;
      uVar24 = (ulong)iVar12;
      if (0 < (long)uVar24) {
        ppNVar16 = (Node **)btAlignedAllocInternal(uVar24 * 8,0x10);
        lVar14 = (long)(pCVar15->m_nodes).m_size;
        if (0 < lVar14) {
          lVar22 = 0;
          do {
            ppNVar16[lVar22] = (pCVar15->m_nodes).m_data[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar14 != lVar22);
        }
        ppNVar5 = (pCVar15->m_nodes).m_data;
        if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
          btAlignedFreeInternal(ppNVar5);
        }
        (pCVar15->m_nodes).m_ownsMemory = true;
        (pCVar15->m_nodes).m_data = ppNVar16;
        (pCVar15->m_nodes).m_capacity = iVar12;
        iVar12 = (this->m_nodes).m_size;
        if (0 < iVar12) {
          iVar29 = (pCVar15->m_nodes).m_size;
          lVar14 = 0;
          do {
            pNVar31 = (this->m_nodes).m_data;
            iVar11 = (int)uVar24;
            if (iVar29 == iVar11) {
              uVar18 = (ulong)(uint)(iVar11 * 2);
              if (iVar11 == 0) {
                uVar18 = 1;
              }
              iVar30 = (int)uVar18;
              if (iVar11 < iVar30) {
                if (iVar30 == 0) {
                  ppNVar16 = (Node **)0x0;
                }
                else {
                  ppNVar16 = (Node **)btAlignedAllocInternal((long)iVar30 << 3,0x10);
                  uVar24 = (ulong)(uint)(pCVar15->m_nodes).m_size;
                }
                iVar29 = (int)uVar24;
                if (0 < iVar29) {
                  uVar33 = 0;
                  do {
                    ppNVar16[uVar33] = (pCVar15->m_nodes).m_data[uVar33];
                    uVar33 = uVar33 + 1;
                  } while ((uVar24 & 0xffffffff) != uVar33);
                }
                ppNVar5 = (pCVar15->m_nodes).m_data;
                if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
                  btAlignedFreeInternal(ppNVar5);
                  iVar29 = (pCVar15->m_nodes).m_size;
                }
                (pCVar15->m_nodes).m_ownsMemory = true;
                (pCVar15->m_nodes).m_data = ppNVar16;
                (pCVar15->m_nodes).m_capacity = iVar30;
                iVar12 = (this->m_nodes).m_size;
              }
              else {
                uVar18 = uVar24 & 0xffffffff;
                iVar29 = iVar11;
              }
            }
            else {
              uVar18 = uVar24 & 0xffffffff;
            }
            (pCVar15->m_nodes).m_data[iVar29] = pNVar31 + lVar14;
            iVar29 = iVar29 + 1;
            (pCVar15->m_nodes).m_size = iVar29;
            lVar14 = lVar14 + 1;
            uVar24 = uVar18;
          } while (lVar14 < iVar12);
        }
      }
      uVar10 = (this->m_clusters).m_size;
      if (uVar10 == (this->m_clusters).m_capacity) {
        iVar12 = 1;
        if (uVar10 != 0) {
          iVar12 = uVar10 * 2;
        }
        if ((int)uVar10 < iVar12) {
          if (iVar12 == 0) {
            ppCVar13 = (Cluster **)0x0;
          }
          else {
            ppCVar13 = (Cluster **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
            uVar10 = (this->m_clusters).m_size;
          }
          if (0 < (int)uVar10) {
            uVar24 = 0;
            do {
              ppCVar13[uVar24] = (this->m_clusters).m_data[uVar24];
              uVar24 = uVar24 + 1;
            } while (uVar10 != uVar24);
          }
          ppCVar4 = (this->m_clusters).m_data;
          if ((ppCVar4 != (Cluster **)0x0) && ((this->m_clusters).m_ownsMemory == true)) {
            btAlignedFreeInternal(ppCVar4);
            uVar10 = (this->m_clusters).m_size;
          }
          (this->m_clusters).m_ownsMemory = true;
          (this->m_clusters).m_data = ppCVar13;
          (this->m_clusters).m_capacity = iVar12;
        }
      }
      (this->m_clusters).m_data[(int)uVar10] = pCVar15;
      iVar12 = uVar10 + 1;
      (this->m_clusters).m_size = iVar12;
      ppCVar13 = (this->m_clusters).m_data;
      pCVar15 = *ppCVar13;
      *ppCVar13 = ppCVar13[(int)uVar10];
      ppCVar13[(int)uVar10] = pCVar15;
    }
    if (0 < iVar12) {
      iVar29 = 0;
      do {
        if (((this->m_clusters).m_data[iVar29]->m_nodes).m_size == 0) {
          releaseCluster(this,iVar29);
          iVar29 = iVar29 + -1;
          iVar12 = (this->m_clusters).m_size;
        }
        iVar29 = iVar29 + 1;
      } while (iVar29 < iVar12);
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b8);
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_e0);
LAB_001d9711:
    iVar12 = (this->m_clusters).m_size;
  }
  else {
    (this->m_clusters).m_size = k;
LAB_001d87f9:
    iVar12 = (this->m_tetras).m_size;
    lVar14 = (long)iVar12;
    if (lVar14 != 0) {
      if (k < iVar12) {
        if ((this->m_clusters).m_capacity < iVar12) {
          ppCVar13 = (Cluster **)btAlignedAllocInternal(lVar14 * 8,0x10);
          lVar22 = (long)(this->m_clusters).m_size;
          if (0 < lVar22) {
            lVar23 = 0;
            do {
              ppCVar13[lVar23] = (this->m_clusters).m_data[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar22 != lVar23);
          }
          ppCVar4 = (this->m_clusters).m_data;
          if ((ppCVar4 != (Cluster **)0x0) && ((this->m_clusters).m_ownsMemory == true)) {
            btAlignedFreeInternal(ppCVar4);
          }
          (this->m_clusters).m_ownsMemory = true;
          (this->m_clusters).m_data = ppCVar13;
          (this->m_clusters).m_capacity = iVar12;
        }
        lVar22 = (long)k;
        do {
          (this->m_clusters).m_data[lVar22] = (Cluster *)0x0;
          lVar22 = lVar22 + 1;
        } while (lVar14 != lVar22);
        (this->m_clusters).m_size = iVar12;
        if (0 < iVar12) {
          lVar14 = 0;
          do {
            pCVar15 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
            (pCVar15->m_masses).m_ownsMemory = true;
            (pCVar15->m_masses).m_data = (float *)0x0;
            (pCVar15->m_masses).m_size = 0;
            (pCVar15->m_masses).m_capacity = 0;
            (pCVar15->m_nodes).m_ownsMemory = true;
            (pCVar15->m_nodes).m_data = (Node **)0x0;
            (pCVar15->m_nodes).m_size = 0;
            (pCVar15->m_nodes).m_capacity = 0;
            (pCVar15->m_framerefs).m_ownsMemory = true;
            (pCVar15->m_framerefs).m_data = (btVector3 *)0x0;
            (pCVar15->m_framerefs).m_size = 0;
            (pCVar15->m_framerefs).m_capacity = 0;
            pCVar15->m_leaf = (btDbvtNode *)0x0;
            pCVar15->m_ndamping = 0.0;
            pCVar15->m_ldamping = 0.0;
            pCVar15->m_adamping = 0.0;
            pCVar15->m_matching = 0.0;
            pCVar15->m_maxSelfCollisionImpulse = 100.0;
            pCVar15->m_selfCollisionImpulseFactor = 0.01;
            pCVar15->m_containsAnchor = false;
            (this->m_clusters).m_data[lVar14] = pCVar15;
            (this->m_clusters).m_data[lVar14]->m_collide = true;
            lVar14 = lVar14 + 1;
          } while (lVar14 < (this->m_clusters).m_size);
        }
      }
      else {
        (this->m_clusters).m_size = iVar12;
      }
      if (0 < (this->m_tetras).m_size) {
        lVar14 = 0;
        do {
          lVar22 = 0;
          do {
            pCVar15 = (this->m_clusters).m_data[lVar14];
            pTVar6 = (this->m_tetras).m_data;
            uVar10 = (pCVar15->m_nodes).m_size;
            if (uVar10 == (pCVar15->m_nodes).m_capacity) {
              iVar12 = uVar10 * 2;
              if (uVar10 == 0) {
                iVar12 = 1;
              }
              if ((int)uVar10 < iVar12) {
                if (iVar12 == 0) {
                  ppNVar16 = (Node **)0x0;
                }
                else {
                  ppNVar16 = (Node **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
                  uVar10 = (pCVar15->m_nodes).m_size;
                }
                if (0 < (int)uVar10) {
                  uVar24 = 0;
                  do {
                    ppNVar16[uVar24] = (pCVar15->m_nodes).m_data[uVar24];
                    uVar24 = uVar24 + 1;
                  } while (uVar10 != uVar24);
                }
                ppNVar5 = (pCVar15->m_nodes).m_data;
                if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
                  btAlignedFreeInternal(ppNVar5);
                  uVar10 = (pCVar15->m_nodes).m_size;
                }
                (pCVar15->m_nodes).m_ownsMemory = true;
                (pCVar15->m_nodes).m_data = ppNVar16;
                (pCVar15->m_nodes).m_capacity = iVar12;
              }
            }
            (pCVar15->m_nodes).m_data[(int)uVar10] = pTVar6[lVar14].m_n[lVar22];
            (pCVar15->m_nodes).m_size = uVar10 + 1;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          lVar14 = lVar14 + 1;
        } while (lVar14 < (this->m_tetras).m_size);
      }
      goto LAB_001d9711;
    }
    iVar12 = (this->m_faces).m_size;
    if (k < iVar12) {
      if ((this->m_clusters).m_capacity < iVar12) {
        if (iVar12 == 0) {
          ppCVar13 = (Cluster **)0x0;
        }
        else {
          ppCVar13 = (Cluster **)btAlignedAllocInternal((long)iVar12 * 8,0x10);
          lVar14 = (long)(this->m_clusters).m_size;
          if (0 < lVar14) {
            lVar22 = 0;
            do {
              ppCVar13[lVar22] = (this->m_clusters).m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar14 != lVar22);
          }
        }
        ppCVar4 = (this->m_clusters).m_data;
        if ((ppCVar4 != (Cluster **)0x0) && ((this->m_clusters).m_ownsMemory == true)) {
          btAlignedFreeInternal(ppCVar4);
        }
        (this->m_clusters).m_ownsMemory = true;
        (this->m_clusters).m_data = ppCVar13;
        (this->m_clusters).m_capacity = iVar12;
      }
      lVar14 = (long)k;
      do {
        (this->m_clusters).m_data[lVar14] = (Cluster *)0x0;
        lVar14 = lVar14 + 1;
      } while (iVar12 != lVar14);
      (this->m_clusters).m_size = iVar12;
      if (0 < iVar12) {
        lVar14 = 0;
        do {
          pCVar15 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
          (pCVar15->m_masses).m_ownsMemory = true;
          (pCVar15->m_masses).m_data = (float *)0x0;
          (pCVar15->m_masses).m_size = 0;
          (pCVar15->m_masses).m_capacity = 0;
          (pCVar15->m_nodes).m_ownsMemory = true;
          (pCVar15->m_nodes).m_data = (Node **)0x0;
          (pCVar15->m_nodes).m_size = 0;
          (pCVar15->m_nodes).m_capacity = 0;
          (pCVar15->m_framerefs).m_ownsMemory = true;
          (pCVar15->m_framerefs).m_data = (btVector3 *)0x0;
          (pCVar15->m_framerefs).m_size = 0;
          (pCVar15->m_framerefs).m_capacity = 0;
          pCVar15->m_leaf = (btDbvtNode *)0x0;
          pCVar15->m_ndamping = 0.0;
          pCVar15->m_ldamping = 0.0;
          pCVar15->m_adamping = 0.0;
          pCVar15->m_matching = 0.0;
          pCVar15->m_maxSelfCollisionImpulse = 100.0;
          pCVar15->m_selfCollisionImpulseFactor = 0.01;
          pCVar15->m_containsAnchor = false;
          (this->m_clusters).m_data[lVar14] = pCVar15;
          (this->m_clusters).m_data[lVar14]->m_collide = true;
          lVar14 = lVar14 + 1;
        } while (lVar14 < (this->m_clusters).m_size);
      }
      if (0 < (this->m_faces).m_size) {
        lVar14 = 0;
        do {
          lVar22 = 0;
          do {
            pCVar15 = (this->m_clusters).m_data[lVar14];
            pFVar7 = (this->m_faces).m_data;
            uVar10 = (pCVar15->m_nodes).m_size;
            if (uVar10 == (pCVar15->m_nodes).m_capacity) {
              iVar12 = uVar10 * 2;
              if (uVar10 == 0) {
                iVar12 = 1;
              }
              if ((int)uVar10 < iVar12) {
                if (iVar12 == 0) {
                  ppNVar16 = (Node **)0x0;
                }
                else {
                  ppNVar16 = (Node **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
                  uVar10 = (pCVar15->m_nodes).m_size;
                }
                if (0 < (int)uVar10) {
                  uVar24 = 0;
                  do {
                    ppNVar16[uVar24] = (pCVar15->m_nodes).m_data[uVar24];
                    uVar24 = uVar24 + 1;
                  } while (uVar10 != uVar24);
                }
                ppNVar5 = (pCVar15->m_nodes).m_data;
                if ((ppNVar5 != (Node **)0x0) && ((pCVar15->m_nodes).m_ownsMemory == true)) {
                  btAlignedFreeInternal(ppNVar5);
                  uVar10 = (pCVar15->m_nodes).m_size;
                }
                (pCVar15->m_nodes).m_ownsMemory = true;
                (pCVar15->m_nodes).m_data = ppNVar16;
                (pCVar15->m_nodes).m_capacity = iVar12;
              }
            }
            (pCVar15->m_nodes).m_data[(int)uVar10] = pFVar7[lVar14].m_n[lVar22];
            (pCVar15->m_nodes).m_size = uVar10 + 1;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          lVar14 = lVar14 + 1;
        } while (lVar14 < (this->m_faces).m_size);
      }
      goto LAB_001d9711;
    }
    (this->m_clusters).m_size = iVar12;
  }
  if (iVar12 == 0) {
    return 0;
  }
  initializeClusters(this);
  updateClusters(this);
  uVar10 = (this->m_clusters).m_size;
  uVar21 = (this->m_clusterConnectivity).m_size;
  uVar26 = uVar10 * uVar10;
  if ((int)uVar26 <= (int)uVar21) goto LAB_001d97ea;
  lVar14 = (long)(int)uVar21;
  if ((this->m_clusterConnectivity).m_capacity < (int)uVar26) {
    if (uVar10 == 0) {
      pbVar20 = (bool *)0x0;
    }
    else {
      pbVar20 = (bool *)btAlignedAllocInternal((ulong)uVar26,0x10);
      uVar21 = (this->m_clusterConnectivity).m_size;
    }
    ptr = (this->m_clusterConnectivity).m_data;
    if ((int)uVar21 < 1) {
      if (ptr != (bool *)0x0) goto LAB_001d97ab;
    }
    else {
      uVar24 = 0;
      do {
        pbVar20[uVar24] = ptr[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
LAB_001d97ab:
      if ((this->m_clusterConnectivity).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    (this->m_clusterConnectivity).m_ownsMemory = true;
    (this->m_clusterConnectivity).m_data = pbVar20;
    (this->m_clusterConnectivity).m_capacity = uVar26;
  }
  else {
    pbVar20 = (this->m_clusterConnectivity).m_data;
  }
  memset(pbVar20 + lVar14,0,(ulong)uVar26 - lVar14);
  uVar10 = (this->m_clusters).m_size;
LAB_001d97ea:
  (this->m_clusterConnectivity).m_size = uVar26;
  if (0 < (int)uVar10) {
    ppCVar13 = (this->m_clusters).m_data;
    pbVar20 = (this->m_clusterConnectivity).m_data;
    uVar24 = (ulong)uVar10;
    uVar18 = 0;
    do {
      pCVar15 = ppCVar13[uVar18];
      pCVar15->m_clusterIndex = (int)uVar18;
      uVar21 = (pCVar15->m_nodes).m_size;
      uVar33 = 0;
      if (0 < (int)uVar21) {
        uVar33 = (ulong)uVar21;
      }
      uVar27 = 0;
      do {
        if (0 < (int)uVar21) {
          pCVar8 = ppCVar13[uVar27];
          uVar26 = (pCVar8->m_nodes).m_size;
          uVar32 = 0;
          do {
            if (0 < (int)uVar26) {
              uVar25 = 0;
              do {
                if ((pCVar15->m_nodes).m_data[uVar32] == (pCVar8->m_nodes).m_data[uVar25]) {
                  bVar28 = true;
                  goto LAB_001d9875;
                }
                uVar25 = uVar25 + 1;
              } while (uVar26 != uVar25);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar33);
        }
        bVar28 = false;
LAB_001d9875:
        pbVar20[uVar27 * uVar24 + uVar18] = bVar28;
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar24);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar24);
  }
  return uVar10;
}

Assistant:

int				btSoftBody::generateClusters(int k,int maxiterations)
{
	int i;
	releaseClusters();
	m_clusters.resize(btMin(k,m_nodes.size()));
	for(i=0;i<m_clusters.size();++i)
	{
		m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
		m_clusters[i]->m_collide=	true;
	}
	k=m_clusters.size();
	if(k>0)
	{
		/* Initialize		*/ 
		btAlignedObjectArray<btVector3>	centers;
		btVector3						cog(0,0,0);
		int								i;
		for(i=0;i<m_nodes.size();++i)
		{
			cog+=m_nodes[i].m_x;
			m_clusters[(i*29873)%m_clusters.size()]->m_nodes.push_back(&m_nodes[i]);
		}
		cog/=(btScalar)m_nodes.size();
		centers.resize(k,cog);
		/* Iterate			*/ 
		const btScalar	slope=16;
		bool			changed;
		int				iterations=0;
		do	{
			const btScalar	w=2-btMin<btScalar>(1,iterations/slope);
			changed=false;
			iterations++;	
			int i;

			for(i=0;i<k;++i)
			{
				btVector3	c(0,0,0);
				for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
				{
					c+=m_clusters[i]->m_nodes[j]->m_x;
				}
				if(m_clusters[i]->m_nodes.size())
				{
					c			/=	(btScalar)m_clusters[i]->m_nodes.size();
					c			=	centers[i]+(c-centers[i])*w;
					changed		|=	((c-centers[i]).length2()>SIMD_EPSILON);
					centers[i]	=	c;
					m_clusters[i]->m_nodes.resize(0);
				}			
			}
			for(i=0;i<m_nodes.size();++i)
			{
				const btVector3	nx=m_nodes[i].m_x;
				int				kbest=0;
				btScalar		kdist=ClusterMetric(centers[0],nx);
				for(int j=1;j<k;++j)
				{
					const btScalar	d=ClusterMetric(centers[j],nx);
					if(d<kdist)
					{
						kbest=j;
						kdist=d;
					}
				}
				m_clusters[kbest]->m_nodes.push_back(&m_nodes[i]);
			}		
		} while(changed&&(iterations<maxiterations));
		/* Merge		*/ 
		btAlignedObjectArray<int>	cids;
		cids.resize(m_nodes.size(),-1);
		for(i=0;i<m_clusters.size();++i)
		{
			for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
			{
				cids[int(m_clusters[i]->m_nodes[j]-&m_nodes[0])]=i;
			}
		}
		for(i=0;i<m_faces.size();++i)
		{
			const int idx[]={	int(m_faces[i].m_n[0]-&m_nodes[0]),
				int(m_faces[i].m_n[1]-&m_nodes[0]),
				int(m_faces[i].m_n[2]-&m_nodes[0])};
			for(int j=0;j<3;++j)
			{
				const int cid=cids[idx[j]];
				for(int q=1;q<3;++q)
				{
					const int kid=idx[(j+q)%3];
					if(cids[kid]!=cid)
					{
						if(m_clusters[cid]->m_nodes.findLinearSearch(&m_nodes[kid])==m_clusters[cid]->m_nodes.size())
						{
							m_clusters[cid]->m_nodes.push_back(&m_nodes[kid]);
						}
					}
				}
			}
		}
		/* Master		*/ 
		if(m_clusters.size()>1)
		{
			Cluster*	pmaster=new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
			pmaster->m_collide	=	false;
			pmaster->m_nodes.reserve(m_nodes.size());
			for(int i=0;i<m_nodes.size();++i) pmaster->m_nodes.push_back(&m_nodes[i]);
			m_clusters.push_back(pmaster);
			btSwap(m_clusters[0],m_clusters[m_clusters.size()-1]);
		}
		/* Terminate	*/ 
		for(i=0;i<m_clusters.size();++i)
		{
			if(m_clusters[i]->m_nodes.size()==0)
			{
				releaseCluster(i--);
			}
		}
	} else
	{
		//create a cluster for each tetrahedron (if tetrahedra exist) or each face
		if (m_tetras.size())
		{
			m_clusters.resize(m_tetras.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}
			for (i=0;i<m_tetras.size();i++)
			{
				for (int j=0;j<4;j++)
				{
					m_clusters[i]->m_nodes.push_back(m_tetras[i].m_n[j]);
				}
			}

		} else
		{
			m_clusters.resize(m_faces.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}

			for(i=0;i<m_faces.size();++i)
			{
				for(int j=0;j<3;++j)
				{
					m_clusters[i]->m_nodes.push_back(m_faces[i].m_n[j]);
				}
			}
		}
	}

	if (m_clusters.size())
	{
		initializeClusters();
		updateClusters();


		//for self-collision
		m_clusterConnectivity.resize(m_clusters.size()*m_clusters.size());
		{
			for (int c0=0;c0<m_clusters.size();c0++)
			{
				m_clusters[c0]->m_clusterIndex=c0;
				for (int c1=0;c1<m_clusters.size();c1++)
				{
					
					bool connected=false;
					Cluster* cla = m_clusters[c0];
					Cluster* clb = m_clusters[c1];
					for (int i=0;!connected&&i<cla->m_nodes.size();i++)
					{
						for (int j=0;j<clb->m_nodes.size();j++)
						{
							if (cla->m_nodes[i] == clb->m_nodes[j])
							{
								connected=true;
								break;
							}
						}
					}
					m_clusterConnectivity[c0+c1*m_clusters.size()]=connected;
				}
			}
		}
	}

	return(m_clusters.size());
}